

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

string * __thiscall
spvtools::val::ValidationState_t::VkErrorID_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id,char *param_2)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (!bVar1) goto switchD_001aec2a_caseD_103d;
  if ((int)id < 0x1333) {
    switch(id) {
    case 0x103a:
      pcVar3 = "[VUID-BaryCoordKHR-BaryCoordKHR-04154] ";
      pcVar2 = "";
      break;
    case 0x103b:
      pcVar3 = "[VUID-BaryCoordKHR-BaryCoordKHR-04155] ";
      pcVar2 = "";
      break;
    case 0x103c:
      pcVar3 = "[VUID-BaryCoordKHR-BaryCoordKHR-04156] ";
      pcVar2 = "";
      break;
    default:
      goto switchD_001aec2a_caseD_103d;
    case 0x1040:
      pcVar3 = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160] ";
      pcVar2 = "";
      break;
    case 0x1041:
      pcVar3 = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161] ";
      pcVar2 = "";
      break;
    case 0x1042:
      pcVar3 = "[VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162] ";
      pcVar2 = "";
      break;
    case 0x1055:
      pcVar3 = "[VUID-BaseInstance-BaseInstance-04181] ";
      pcVar2 = "";
      break;
    case 0x1056:
      pcVar3 = "[VUID-BaseInstance-BaseInstance-04182] ";
      pcVar2 = "";
      break;
    case 0x1057:
      pcVar3 = "[VUID-BaseInstance-BaseInstance-04183] ";
      pcVar2 = "";
      break;
    case 0x1058:
      pcVar3 = "[VUID-BaseVertex-BaseVertex-04184] ";
      pcVar2 = "";
      break;
    case 0x1059:
      pcVar3 = "[VUID-BaseVertex-BaseVertex-04185] ";
      pcVar2 = "";
      break;
    case 0x105a:
      pcVar3 = "[VUID-BaseVertex-BaseVertex-04186] ";
      pcVar2 = "";
      break;
    case 0x105b:
      pcVar3 = "[VUID-ClipDistance-ClipDistance-04187] ";
      pcVar2 = "";
      break;
    case 0x105c:
      pcVar3 = "[VUID-ClipDistance-ClipDistance-04188] ";
      pcVar2 = "";
      break;
    case 0x105d:
      pcVar3 = "[VUID-ClipDistance-ClipDistance-04189] ";
      pcVar2 = "";
      break;
    case 0x105e:
      pcVar3 = "[VUID-ClipDistance-ClipDistance-04190] ";
      pcVar2 = "";
      break;
    case 0x105f:
      pcVar3 = "[VUID-ClipDistance-ClipDistance-04191] ";
      pcVar2 = "";
      break;
    case 0x1064:
      pcVar3 = "[VUID-CullDistance-CullDistance-04196] ";
      pcVar2 = "";
      break;
    case 0x1065:
      pcVar3 = "[VUID-CullDistance-CullDistance-04197] ";
      pcVar2 = "";
      break;
    case 0x1066:
      pcVar3 = "[VUID-CullDistance-CullDistance-04198] ";
      pcVar2 = "";
      break;
    case 0x1067:
      pcVar3 = "[VUID-CullDistance-CullDistance-04199] ";
      pcVar2 = "";
      break;
    case 0x1068:
      pcVar3 = "[VUID-CullDistance-CullDistance-04200] ";
      pcVar2 = "";
      break;
    case 0x106d:
      pcVar3 = "[VUID-DeviceIndex-DeviceIndex-04205] ";
      pcVar2 = "";
      break;
    case 0x106e:
      pcVar3 = "[VUID-DeviceIndex-DeviceIndex-04206] ";
      pcVar2 = "";
      break;
    case 0x106f:
      pcVar3 = "[VUID-DrawIndex-DrawIndex-04207] ";
      pcVar2 = "";
      break;
    case 0x1070:
      pcVar3 = "[VUID-DrawIndex-DrawIndex-04208] ";
      pcVar2 = "";
      break;
    case 0x1071:
      pcVar3 = "[VUID-DrawIndex-DrawIndex-04209] ";
      pcVar2 = "";
      break;
    case 0x1072:
      pcVar3 = "[VUID-FragCoord-FragCoord-04210] ";
      pcVar2 = "";
      break;
    case 0x1073:
      pcVar3 = "[VUID-FragCoord-FragCoord-04211] ";
      pcVar2 = "";
      break;
    case 0x1074:
      pcVar3 = "[VUID-FragCoord-FragCoord-04212] ";
      pcVar2 = "";
      break;
    case 0x1075:
      pcVar3 = "[VUID-FragDepth-FragDepth-04213] ";
      pcVar2 = "";
      break;
    case 0x1076:
      pcVar3 = "[VUID-FragDepth-FragDepth-04214] ";
      pcVar2 = "";
      break;
    case 0x1077:
      pcVar3 = "[VUID-FragDepth-FragDepth-04215] ";
      pcVar2 = "";
      break;
    case 0x1078:
      pcVar3 = "[VUID-FragDepth-FragDepth-04216] ";
      pcVar2 = "";
      break;
    case 0x1079:
      pcVar3 = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217] ";
      pcVar2 = "";
      break;
    case 0x107a:
      pcVar3 = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218] ";
      pcVar2 = "";
      break;
    case 0x107b:
      pcVar3 = "[VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219] ";
      pcVar2 = "";
      break;
    case 0x107c:
      pcVar3 = "[VUID-FragSizeEXT-FragSizeEXT-04220] ";
      pcVar2 = "";
      break;
    case 0x107d:
      pcVar3 = "[VUID-FragSizeEXT-FragSizeEXT-04221] ";
      pcVar2 = "";
      break;
    case 0x107e:
      pcVar3 = "[VUID-FragSizeEXT-FragSizeEXT-04222] ";
      pcVar2 = "";
      break;
    case 0x107f:
      pcVar3 = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04223] ";
      pcVar2 = "";
      break;
    case 0x1080:
      pcVar3 = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04224] ";
      pcVar2 = "";
      break;
    case 0x1081:
      pcVar3 = "[VUID-FragStencilRefEXT-FragStencilRefEXT-04225] ";
      pcVar2 = "";
      break;
    case 0x1085:
      pcVar3 = "[VUID-FrontFacing-FrontFacing-04229] ";
      pcVar2 = "";
      break;
    case 0x1086:
      pcVar3 = "[VUID-FrontFacing-FrontFacing-04230] ";
      pcVar2 = "";
      break;
    case 0x1087:
      pcVar3 = "[VUID-FrontFacing-FrontFacing-04231] ";
      pcVar2 = "";
      break;
    case 0x1088:
      pcVar3 = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04232] ";
      pcVar2 = "";
      break;
    case 0x1089:
      pcVar3 = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04233] ";
      pcVar2 = "";
      break;
    case 0x108a:
      pcVar3 = "[VUID-FullyCoveredEXT-FullyCoveredEXT-04234] ";
      pcVar2 = "";
      break;
    case 0x108c:
      pcVar3 = "[VUID-GlobalInvocationId-GlobalInvocationId-04236] ";
      pcVar2 = "";
      break;
    case 0x108d:
      pcVar3 = "[VUID-GlobalInvocationId-GlobalInvocationId-04237] ";
      pcVar2 = "";
      break;
    case 0x108e:
      pcVar3 = "[VUID-GlobalInvocationId-GlobalInvocationId-04238] ";
      pcVar2 = "";
      break;
    case 0x108f:
      pcVar3 = "[VUID-HelperInvocation-HelperInvocation-04239] ";
      pcVar2 = "";
      break;
    case 0x1090:
      pcVar3 = "[VUID-HelperInvocation-HelperInvocation-04240] ";
      pcVar2 = "";
      break;
    case 0x1091:
      pcVar3 = "[VUID-HelperInvocation-HelperInvocation-04241] ";
      pcVar2 = "";
      break;
    case 0x1092:
      pcVar3 = "[VUID-HitKindKHR-HitKindKHR-04242] ";
      pcVar2 = "";
      break;
    case 0x1093:
      pcVar3 = "[VUID-HitKindKHR-HitKindKHR-04243] ";
      pcVar2 = "";
      break;
    case 0x1094:
      pcVar3 = "[VUID-HitKindKHR-HitKindKHR-04244] ";
      pcVar2 = "";
      break;
    case 0x1095:
      pcVar3 = "[VUID-HitTNV-HitTNV-04245] ";
      pcVar2 = "";
      break;
    case 0x1096:
      pcVar3 = "[VUID-HitTNV-HitTNV-04246] ";
      pcVar2 = "";
      break;
    case 0x1097:
      pcVar3 = "[VUID-HitTNV-HitTNV-04247] ";
      pcVar2 = "";
      break;
    case 0x1098:
      pcVar3 = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248] ";
      pcVar2 = "";
      break;
    case 0x1099:
      pcVar3 = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249] ";
      pcVar2 = "";
      break;
    case 0x109a:
      pcVar3 = "[VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250] ";
      pcVar2 = "";
      break;
    case 0x109b:
      pcVar3 = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251] ";
      pcVar2 = "";
      break;
    case 0x109c:
      pcVar3 = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252] ";
      pcVar2 = "";
      break;
    case 0x109d:
      pcVar3 = "[VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253] ";
      pcVar2 = "";
      break;
    case 0x109e:
      pcVar3 = "[VUID-InstanceId-InstanceId-04254] ";
      pcVar2 = "";
      break;
    case 0x109f:
      pcVar3 = "[VUID-InstanceId-InstanceId-04255] ";
      pcVar2 = "";
      break;
    case 0x10a0:
      pcVar3 = "[VUID-InstanceId-InstanceId-04256] ";
      pcVar2 = "";
      break;
    case 0x10a1:
      pcVar3 = "[VUID-InvocationId-InvocationId-04257] ";
      pcVar2 = "";
      break;
    case 0x10a2:
      pcVar3 = "[VUID-InvocationId-InvocationId-04258] ";
      pcVar2 = "";
      break;
    case 0x10a3:
      pcVar3 = "[VUID-InvocationId-InvocationId-04259] ";
      pcVar2 = "";
      break;
    case 0x10a7:
      pcVar3 = "[VUID-InstanceIndex-InstanceIndex-04263] ";
      pcVar2 = "";
      break;
    case 0x10a8:
      pcVar3 = "[VUID-InstanceIndex-InstanceIndex-04264] ";
      pcVar2 = "";
      break;
    case 0x10a9:
      pcVar3 = "[VUID-InstanceIndex-InstanceIndex-04265] ";
      pcVar2 = "";
      break;
    case 0x10aa:
      pcVar3 = "[VUID-LaunchIdKHR-LaunchIdKHR-04266] ";
      pcVar2 = "";
      break;
    case 0x10ab:
      pcVar3 = "[VUID-LaunchIdKHR-LaunchIdKHR-04267] ";
      pcVar2 = "";
      break;
    case 0x10ac:
      pcVar3 = "[VUID-LaunchIdKHR-LaunchIdKHR-04268] ";
      pcVar2 = "";
      break;
    case 0x10ad:
      pcVar3 = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04269] ";
      pcVar2 = "";
      break;
    case 0x10ae:
      pcVar3 = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04270] ";
      pcVar2 = "";
      break;
    case 0x10af:
      pcVar3 = "[VUID-LaunchSizeKHR-LaunchSizeKHR-04271] ";
      pcVar2 = "";
      break;
    case 0x10b0:
      pcVar3 = "[VUID-Layer-Layer-04272] ";
      pcVar2 = "";
      break;
    case 0x10b1:
      pcVar3 = "[VUID-Layer-Layer-04273] ";
      pcVar2 = "";
      break;
    case 0x10b2:
      pcVar3 = "[VUID-Layer-Layer-04274] ";
      pcVar2 = "";
      break;
    case 0x10b3:
      pcVar3 = "[VUID-Layer-Layer-04275] ";
      pcVar2 = "";
      break;
    case 0x10b4:
      pcVar3 = "[VUID-Layer-Layer-04276] ";
      pcVar2 = "";
      break;
    case 0x10b9:
      pcVar3 = "[VUID-LocalInvocationId-LocalInvocationId-04281] ";
      pcVar2 = "";
      break;
    case 0x10ba:
      pcVar3 = "[VUID-LocalInvocationId-LocalInvocationId-04282] ";
      pcVar2 = "";
      break;
    case 0x10bb:
      pcVar3 = "[VUID-LocalInvocationId-LocalInvocationId-04283] ";
      pcVar2 = "";
      break;
    case 0x10c5:
      pcVar3 = "[VUID-NumSubgroups-NumSubgroups-04293] ";
      pcVar2 = "";
      break;
    case 0x10c6:
      pcVar3 = "[VUID-NumSubgroups-NumSubgroups-04294] ";
      pcVar2 = "";
      break;
    case 0x10c7:
      pcVar3 = "[VUID-NumSubgroups-NumSubgroups-04295] ";
      pcVar2 = "";
      break;
    case 0x10c8:
      pcVar3 = "[VUID-NumWorkgroups-NumWorkgroups-04296] ";
      pcVar2 = "";
      break;
    case 0x10c9:
      pcVar3 = "[VUID-NumWorkgroups-NumWorkgroups-04297] ";
      pcVar2 = "";
      break;
    case 0x10ca:
      pcVar3 = "[VUID-NumWorkgroups-NumWorkgroups-04298] ";
      pcVar2 = "";
      break;
    case 0x10cb:
      pcVar3 = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299] ";
      pcVar2 = "";
      break;
    case 0x10cc:
      pcVar3 = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300] ";
      pcVar2 = "";
      break;
    case 0x10cd:
      pcVar3 = "[VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301] ";
      pcVar2 = "";
      break;
    case 0x10ce:
      pcVar3 = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302] ";
      pcVar2 = "";
      break;
    case 0x10cf:
      pcVar3 = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303] ";
      pcVar2 = "";
      break;
    case 0x10d0:
      pcVar3 = "[VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304] ";
      pcVar2 = "";
      break;
    case 0x10d1:
      pcVar3 = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305] ";
      pcVar2 = "";
      break;
    case 0x10d2:
      pcVar3 = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306] ";
      pcVar2 = "";
      break;
    case 0x10d3:
      pcVar3 = "[VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307] ";
      pcVar2 = "";
      break;
    case 0x10d4:
      pcVar3 = "[VUID-PatchVertices-PatchVertices-04308] ";
      pcVar2 = "";
      break;
    case 0x10d5:
      pcVar3 = "[VUID-PatchVertices-PatchVertices-04309] ";
      pcVar2 = "";
      break;
    case 0x10d6:
      pcVar3 = "[VUID-PatchVertices-PatchVertices-04310] ";
      pcVar2 = "";
      break;
    case 0x10d7:
      pcVar3 = "[VUID-PointCoord-PointCoord-04311] ";
      pcVar2 = "";
      break;
    case 0x10d8:
      pcVar3 = "[VUID-PointCoord-PointCoord-04312] ";
      pcVar2 = "";
      break;
    case 0x10d9:
      pcVar3 = "[VUID-PointCoord-PointCoord-04313] ";
      pcVar2 = "";
      break;
    case 0x10da:
      pcVar3 = "[VUID-PointSize-PointSize-04314] ";
      pcVar2 = "";
      break;
    case 0x10db:
      pcVar3 = "[VUID-PointSize-PointSize-04315] ";
      pcVar2 = "";
      break;
    case 0x10dc:
      pcVar3 = "[VUID-PointSize-PointSize-04316] ";
      pcVar2 = "";
      break;
    case 0x10dd:
      pcVar3 = "[VUID-PointSize-PointSize-04317] ";
      pcVar2 = "";
      break;
    case 0x10de:
      pcVar3 = "[VUID-Position-Position-04318] ";
      pcVar2 = "";
      break;
    case 0x10df:
      pcVar3 = "[VUID-Position-Position-04319] ";
      pcVar2 = "";
      break;
    case 0x10e0:
      pcVar3 = "[VUID-Position-Position-04320] ";
      pcVar2 = "";
      break;
    case 0x10e1:
      pcVar3 = "[VUID-Position-Position-04321] ";
      pcVar2 = "";
      break;
    case 0x10ea:
      pcVar3 = "[VUID-PrimitiveId-PrimitiveId-04330] ";
      pcVar2 = "";
      break;
    case 0x10ee:
      pcVar3 = "[VUID-PrimitiveId-PrimitiveId-04334] ";
      pcVar2 = "";
      break;
    case 0x10f1:
      pcVar3 = "[VUID-PrimitiveId-PrimitiveId-04337] ";
      pcVar2 = "";
      break;
    case 0x10f9:
      pcVar3 = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345] ";
      pcVar2 = "";
      break;
    case 0x10fa:
      pcVar3 = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346] ";
      pcVar2 = "";
      break;
    case 0x10fb:
      pcVar3 = "[VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347] ";
      pcVar2 = "";
      break;
    case 0x10fc:
      pcVar3 = "[VUID-RayTmaxKHR-RayTmaxKHR-04348] ";
      pcVar2 = "";
      break;
    case 0x10fd:
      pcVar3 = "[VUID-RayTmaxKHR-RayTmaxKHR-04349] ";
      pcVar2 = "";
      break;
    case 0x10fe:
      pcVar3 = "[VUID-RayTmaxKHR-RayTmaxKHR-04350] ";
      pcVar2 = "";
      break;
    case 0x10ff:
      pcVar3 = "[VUID-RayTminKHR-RayTminKHR-04351] ";
      pcVar2 = "";
      break;
    case 0x1100:
      pcVar3 = "[VUID-RayTminKHR-RayTminKHR-04352] ";
      pcVar2 = "";
      break;
    case 0x1101:
      pcVar3 = "[VUID-RayTminKHR-RayTminKHR-04353] ";
      pcVar2 = "";
      break;
    case 0x1102:
      pcVar3 = "[VUID-SampleId-SampleId-04354] ";
      pcVar2 = "";
      break;
    case 0x1103:
      pcVar3 = "[VUID-SampleId-SampleId-04355] ";
      pcVar2 = "";
      break;
    case 0x1104:
      pcVar3 = "[VUID-SampleId-SampleId-04356] ";
      pcVar2 = "";
      break;
    case 0x1105:
      pcVar3 = "[VUID-SampleMask-SampleMask-04357] ";
      pcVar2 = "";
      break;
    case 0x1106:
      pcVar3 = "[VUID-SampleMask-SampleMask-04358] ";
      pcVar2 = "";
      break;
    case 0x1107:
      pcVar3 = "[VUID-SampleMask-SampleMask-04359] ";
      pcVar2 = "";
      break;
    case 0x1108:
      pcVar3 = "[VUID-SamplePosition-SamplePosition-04360] ";
      pcVar2 = "";
      break;
    case 0x1109:
      pcVar3 = "[VUID-SamplePosition-SamplePosition-04361] ";
      pcVar2 = "";
      break;
    case 0x110a:
      pcVar3 = "[VUID-SamplePosition-SamplePosition-04362] ";
      pcVar2 = "";
      break;
    case 0x110f:
      pcVar3 = "[VUID-SubgroupId-SubgroupId-04367] ";
      pcVar2 = "";
      break;
    case 0x1110:
      pcVar3 = "[VUID-SubgroupId-SubgroupId-04368] ";
      pcVar2 = "";
      break;
    case 0x1111:
      pcVar3 = "[VUID-SubgroupId-SubgroupId-04369] ";
      pcVar2 = "";
      break;
    case 0x1112:
      pcVar3 = "[VUID-SubgroupEqMask-SubgroupEqMask-04370] ";
      pcVar2 = "";
      break;
    case 0x1113:
      pcVar3 = "[VUID-SubgroupEqMask-SubgroupEqMask-04371] ";
      pcVar2 = "";
      break;
    case 0x1114:
      pcVar3 = "[VUID-SubgroupGeMask-SubgroupGeMask-04372] ";
      pcVar2 = "";
      break;
    case 0x1115:
      pcVar3 = "[VUID-SubgroupGeMask-SubgroupGeMask-04373] ";
      pcVar2 = "";
      break;
    case 0x1116:
      pcVar3 = "[VUID-SubgroupGtMask-SubgroupGtMask-04374] ";
      pcVar2 = "";
      break;
    case 0x1117:
      pcVar3 = "[VUID-SubgroupGtMask-SubgroupGtMask-04375] ";
      pcVar2 = "";
      break;
    case 0x1118:
      pcVar3 = "[VUID-SubgroupLeMask-SubgroupLeMask-04376] ";
      pcVar2 = "";
      break;
    case 0x1119:
      pcVar3 = "[VUID-SubgroupLeMask-SubgroupLeMask-04377] ";
      pcVar2 = "";
      break;
    case 0x111a:
      pcVar3 = "[VUID-SubgroupLtMask-SubgroupLtMask-04378] ";
      pcVar2 = "";
      break;
    case 0x111b:
      pcVar3 = "[VUID-SubgroupLtMask-SubgroupLtMask-04379] ";
      pcVar2 = "";
      break;
    case 0x111c:
      pcVar3 = "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380] ";
      pcVar2 = "";
      break;
    case 0x111d:
      pcVar3 = "[VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381] ";
      pcVar2 = "";
      break;
    case 0x111e:
      pcVar3 = "[VUID-SubgroupSize-SubgroupSize-04382] ";
      pcVar2 = "";
      break;
    case 0x111f:
      pcVar3 = "[VUID-SubgroupSize-SubgroupSize-04383] ";
      pcVar2 = "";
      break;
    case 0x1123:
      pcVar3 = "[VUID-TessCoord-TessCoord-04387] ";
      pcVar2 = "";
      break;
    case 0x1124:
      pcVar3 = "[VUID-TessCoord-TessCoord-04388] ";
      pcVar2 = "";
      break;
    case 0x1125:
      pcVar3 = "[VUID-TessCoord-TessCoord-04389] ";
      pcVar2 = "";
      break;
    case 0x1126:
      pcVar3 = "[VUID-TessLevelOuter-TessLevelOuter-04390] ";
      pcVar2 = "";
      break;
    case 0x1127:
      pcVar3 = "[VUID-TessLevelOuter-TessLevelOuter-04391] ";
      pcVar2 = "";
      break;
    case 0x1128:
      pcVar3 = "[VUID-TessLevelOuter-TessLevelOuter-04392] ";
      pcVar2 = "";
      break;
    case 0x1129:
      pcVar3 = "[VUID-TessLevelOuter-TessLevelOuter-04393] ";
      pcVar2 = "";
      break;
    case 0x112a:
      pcVar3 = "[VUID-TessLevelInner-TessLevelInner-04394] ";
      pcVar2 = "";
      break;
    case 0x112b:
      pcVar3 = "[VUID-TessLevelInner-TessLevelInner-04395] ";
      pcVar2 = "";
      break;
    case 0x112c:
      pcVar3 = "[VUID-TessLevelInner-TessLevelInner-04396] ";
      pcVar2 = "";
      break;
    case 0x112d:
      pcVar3 = "[VUID-TessLevelInner-TessLevelInner-04397] ";
      pcVar2 = "";
      break;
    case 0x112e:
      pcVar3 = "[VUID-VertexIndex-VertexIndex-04398] ";
      pcVar2 = "";
      break;
    case 0x112f:
      pcVar3 = "[VUID-VertexIndex-VertexIndex-04399] ";
      pcVar2 = "";
      break;
    case 0x1130:
      pcVar3 = "[VUID-VertexIndex-VertexIndex-04400] ";
      pcVar2 = "";
      break;
    case 0x1131:
      pcVar3 = "[VUID-ViewIndex-ViewIndex-04401] ";
      pcVar2 = "";
      break;
    case 0x1132:
      pcVar3 = "[VUID-ViewIndex-ViewIndex-04402] ";
      pcVar2 = "";
      break;
    case 0x1133:
      pcVar3 = "[VUID-ViewIndex-ViewIndex-04403] ";
      pcVar2 = "";
      break;
    case 0x1134:
      pcVar3 = "[VUID-ViewportIndex-ViewportIndex-04404] ";
      pcVar2 = "";
      break;
    case 0x1135:
      pcVar3 = "[VUID-ViewportIndex-ViewportIndex-04405] ";
      pcVar2 = "";
      break;
    case 0x1136:
      pcVar3 = "[VUID-ViewportIndex-ViewportIndex-04406] ";
      pcVar2 = "";
      break;
    case 0x1137:
      pcVar3 = "[VUID-ViewportIndex-ViewportIndex-04407] ";
      pcVar2 = "";
      break;
    case 0x1138:
      pcVar3 = "[VUID-ViewportIndex-ViewportIndex-04408] ";
      pcVar2 = "";
      break;
    case 0x1146:
      pcVar3 = "[VUID-WorkgroupId-WorkgroupId-04422] ";
      pcVar2 = "";
      break;
    case 0x1147:
      pcVar3 = "[VUID-WorkgroupId-WorkgroupId-04423] ";
      pcVar2 = "";
      break;
    case 0x1148:
      pcVar3 = "[VUID-WorkgroupId-WorkgroupId-04424] ";
      pcVar2 = "";
      break;
    case 0x1149:
      pcVar3 = "[VUID-WorkgroupSize-WorkgroupSize-04425] ";
      pcVar2 = "";
      break;
    case 0x114a:
      pcVar3 = "[VUID-WorkgroupSize-WorkgroupSize-04426] ";
      pcVar2 = "";
      break;
    case 0x114b:
      pcVar3 = "[VUID-WorkgroupSize-WorkgroupSize-04427] ";
      pcVar2 = "";
      break;
    case 0x114c:
      pcVar3 = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428] ";
      pcVar2 = "";
      break;
    case 0x114d:
      pcVar3 = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429] ";
      pcVar2 = "";
      break;
    case 0x114e:
      pcVar3 = "[VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430] ";
      pcVar2 = "";
      break;
    case 0x114f:
      pcVar3 = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431] ";
      pcVar2 = "";
      break;
    case 0x1150:
      pcVar3 = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432] ";
      pcVar2 = "";
      break;
    case 0x1151:
      pcVar3 = "[VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433] ";
      pcVar2 = "";
      break;
    case 0x1152:
      pcVar3 = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04434] ";
      pcVar2 = "";
      break;
    case 0x1153:
      pcVar3 = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04435] ";
      pcVar2 = "";
      break;
    case 0x1154:
      pcVar3 = "[VUID-WorldToObjectKHR-WorldToObjectKHR-04436] ";
      pcVar2 = "";
      break;
    case 0x1184:
      pcVar3 = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484] ";
      pcVar2 = "";
      break;
    case 0x1185:
      pcVar3 = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485] ";
      pcVar2 = "";
      break;
    case 0x1186:
      pcVar3 = "[VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486] ";
      pcVar2 = "";
      break;
    case 0x118a:
      pcVar3 = "[VUID-ShadingRateKHR-ShadingRateKHR-04490] ";
      pcVar2 = "";
      break;
    case 0x118b:
      pcVar3 = "[VUID-ShadingRateKHR-ShadingRateKHR-04491] ";
      pcVar2 = "";
      break;
    case 0x118c:
      pcVar3 = "[VUID-ShadingRateKHR-ShadingRateKHR-04492] ";
      pcVar2 = "";
      break;
    case 0x1219:
      pcVar3 = "[VUID-StandaloneSpirv-None-04633] ";
      pcVar2 = "";
      break;
    case 0x121a:
      pcVar3 = "[VUID-StandaloneSpirv-None-04634] ";
      pcVar2 = "";
      break;
    case 0x121b:
      pcVar3 = "[VUID-StandaloneSpirv-None-04635] ";
      pcVar2 = "";
      break;
    case 0x121c:
      pcVar3 = "[VUID-StandaloneSpirv-None-04636] ";
      pcVar2 = "";
      break;
    case 0x121d:
      pcVar3 = "[VUID-StandaloneSpirv-None-04637] ";
      pcVar2 = "";
      break;
    case 0x121e:
      pcVar3 = "[VUID-StandaloneSpirv-None-04638] ";
      pcVar2 = "";
      break;
    case 0x1220:
      pcVar3 = "[VUID-StandaloneSpirv-None-04640] ";
      pcVar2 = "";
      break;
    case 0x1221:
      pcVar3 = "[VUID-StandaloneSpirv-None-04641] ";
      pcVar2 = "";
      break;
    case 0x1222:
      pcVar3 = "[VUID-StandaloneSpirv-None-04642] ";
      pcVar2 = "";
      break;
    case 0x1223:
      pcVar3 = "[VUID-StandaloneSpirv-None-04643] ";
      pcVar2 = "";
      break;
    case 0x1224:
      pcVar3 = "[VUID-StandaloneSpirv-None-04644] ";
      pcVar2 = "";
      break;
    case 0x1225:
      pcVar3 = "[VUID-StandaloneSpirv-None-04645] ";
      pcVar2 = "";
      break;
    case 0x122a:
      pcVar3 = "[VUID-StandaloneSpirv-OpControlBarrier-04650] ";
      pcVar2 = "";
      break;
    case 0x122b:
      pcVar3 = "[VUID-StandaloneSpirv-OpVariable-04651] ";
      pcVar2 = "";
      break;
    case 0x122c:
      pcVar3 = "[VUID-StandaloneSpirv-OpReadClockKHR-04652] ";
      pcVar2 = "";
      break;
    case 0x122d:
      pcVar3 = "[VUID-StandaloneSpirv-OriginLowerLeft-04653] ";
      pcVar2 = "";
      break;
    case 0x122e:
      pcVar3 = "[VUID-StandaloneSpirv-PixelCenterInteger-04654] ";
      pcVar2 = "";
      break;
    case 0x122f:
      pcVar3 = "[VUID-StandaloneSpirv-UniformConstant-04655] ";
      pcVar2 = "";
      break;
    case 0x1230:
      pcVar3 = "[VUID-StandaloneSpirv-OpTypeImage-04656] ";
      pcVar2 = "";
      break;
    case 0x1231:
      pcVar3 = "[VUID-StandaloneSpirv-OpTypeImage-04657] ";
      pcVar2 = "";
      break;
    case 0x1232:
      pcVar3 = "[VUID-StandaloneSpirv-OpImageTexelPointer-04658] ";
      pcVar2 = "";
      break;
    case 0x1233:
      pcVar3 = "[VUID-StandaloneSpirv-OpImageQuerySizeLod-04659] ";
      pcVar2 = "";
      break;
    case 0x1237:
      pcVar3 = "[VUID-StandaloneSpirv-Offset-04663] ";
      pcVar2 = "";
      break;
    case 0x1238:
      pcVar3 = "[VUID-StandaloneSpirv-OpImageGather-04664] ";
      pcVar2 = "";
      break;
    case 0x123b:
      pcVar3 = "[VUID-StandaloneSpirv-None-04667] ";
      pcVar2 = "";
      break;
    case 0x123d:
      pcVar3 = "[VUID-StandaloneSpirv-GLSLShared-04669] ";
      pcVar2 = "";
      break;
    case 0x123e:
      pcVar3 = "[VUID-StandaloneSpirv-Flat-04670] ";
      pcVar2 = "";
      break;
    case 0x1243:
      pcVar3 = "[VUID-StandaloneSpirv-FPRoundingMode-04675] ";
      pcVar2 = "";
      break;
    case 0x1245:
      pcVar3 = "[VUID-StandaloneSpirv-Invariant-04677] ";
      pcVar2 = "";
      break;
    case 0x1248:
      pcVar3 = "[VUID-StandaloneSpirv-OpTypeRuntimeArray-04680] ";
      pcVar2 = "";
      break;
    case 0x124a:
      pcVar3 = "[VUID-StandaloneSpirv-OpControlBarrier-04682] ";
      pcVar2 = "";
      break;
    case 0x124d:
      pcVar3 = "[VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685] ";
      pcVar2 = "";
      break;
    case 0x124e:
      pcVar3 = "[VUID-StandaloneSpirv-None-04686] ";
      pcVar2 = "";
      break;
    case 0x125a:
      pcVar3 = "[VUID-StandaloneSpirv-RayPayloadKHR-04698] ";
      pcVar2 = "";
      break;
    case 0x125b:
      pcVar3 = "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699] ";
      pcVar2 = "";
      break;
    case 0x125c:
      pcVar3 = "[VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700] ";
      pcVar2 = "";
      break;
    case 0x125d:
      pcVar3 = "[VUID-StandaloneSpirv-HitAttributeKHR-04701] ";
      pcVar2 = "";
      break;
    case 0x125e:
      pcVar3 = "[VUID-StandaloneSpirv-HitAttributeKHR-04702] ";
      pcVar2 = "";
      break;
    case 0x125f:
      pcVar3 = "[VUID-StandaloneSpirv-HitAttributeKHR-04703] ";
      pcVar2 = "";
      break;
    case 0x1260:
      pcVar3 = "[VUID-StandaloneSpirv-CallableDataKHR-04704] ";
      pcVar2 = "";
      break;
    case 0x1261:
      pcVar3 = "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04705] ";
      pcVar2 = "";
      break;
    case 0x1262:
      pcVar3 = "[VUID-StandaloneSpirv-IncomingCallableDataKHR-04706] ";
      pcVar2 = "";
      break;
    case 0x1264:
      pcVar3 = "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708] ";
      pcVar2 = "";
      break;
    case 0x1266:
      pcVar3 = "[VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710] ";
      pcVar2 = "";
      break;
    case 0x1267:
      pcVar3 = "[VUID-StandaloneSpirv-OpTypeForwardPointer-04711] ";
      pcVar2 = "";
      break;
    case 0x127a:
      pcVar3 = "[VUID-StandaloneSpirv-OpAtomicStore-04730] ";
      pcVar2 = "";
      break;
    case 0x127b:
      pcVar3 = "[VUID-StandaloneSpirv-OpAtomicLoad-04731] ";
      pcVar2 = "";
      break;
    case 0x127c:
      pcVar3 = "[VUID-StandaloneSpirv-OpMemoryBarrier-04732] ";
      pcVar2 = "";
      break;
    case 0x127d:
      pcVar3 = "[VUID-StandaloneSpirv-OpMemoryBarrier-04733] ";
      pcVar2 = "";
      break;
    case 0x127e:
      pcVar3 = "[VUID-StandaloneSpirv-OpVariable-04734] ";
      pcVar2 = "";
      break;
    case 0x1288:
      pcVar3 = "[VUID-StandaloneSpirv-Flat-04744] ";
      pcVar2 = "";
      break;
    case 0x12a9:
      pcVar3 = "[VUID-StandaloneSpirv-OpImage-04777] ";
      pcVar2 = "";
      break;
    case 0x12ac:
      pcVar3 = "[VUID-StandaloneSpirv-Result-04780] ";
      pcVar2 = "";
      break;
    case 0x12ad:
      pcVar3 = "[VUID-StandaloneSpirv-Base-04781] ";
      pcVar2 = "";
    }
    goto LAB_001b05c2;
  }
  if (0x1a96 < (int)id) {
    if (0x1bce < (int)id) {
      if ((int)id < 0x1e17) {
        if ((int)id < 0x1c99) {
          if (id == 0x1bcf) {
            pcVar3 = "[VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x1c7a) {
            pcVar3 = "[VUID-StandaloneSpirv-Input-07290] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x1c98) {
            pcVar3 = "[VUID-StandaloneSpirv-ExecutionModel-07320] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
        }
        else if ((int)id < 0x1de3) {
          if (id == 0x1c99) {
            pcVar3 = "[VUID-StandaloneSpirv-None-07321] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x1de2) {
            pcVar3 = "[VUID-StandaloneSpirv-Base-07650] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
        }
        else {
          if (id == 0x1de3) {
            pcVar3 = "[VUID-StandaloneSpirv-Base-07651] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x1de4) {
            pcVar3 = "[VUID-StandaloneSpirv-Base-07652] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
        }
      }
      else if ((int)id < 0x230d) {
        if ((int)id < 0x2211) {
          if (id == 0x1e17) {
            pcVar3 = "[VUID-StandaloneSpirv-Component-07703] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x1f0f) {
            pcVar3 = "[VUID-StandaloneSpirv-SubgroupVoteKHR-07951] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
        }
        else {
          if (id == 0x2211) {
            pcVar3 = "[VUID-StandaloneSpirv-OpEntryPoint-08721] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
          if (id == 0x2212) {
            pcVar3 = "[VUID-StandaloneSpirv-OpEntryPoint-08722] ";
            pcVar2 = "";
            goto LAB_001b05c2;
          }
        }
      }
      else if ((int)id < 0x25ba) {
        if (id == 0x230d) {
          pcVar3 = "[VUID-StandaloneSpirv-Pointer-08973] ";
          pcVar2 = "";
          goto LAB_001b05c2;
        }
        if (id == 0x25a6) {
          pcVar3 = "[VUID-StandaloneSpirv-OpTypeImage-09638] ";
          pcVar2 = "";
          goto LAB_001b05c2;
        }
      }
      else {
        if (id == 0x25ba) {
          pcVar3 = "[VUID-StandaloneSpirv-OpEntryPoint-09658] ";
          pcVar2 = "";
          goto LAB_001b05c2;
        }
        if (id == 0x25bb) {
          pcVar3 = "[VUID-StandaloneSpirv-OpEntryPoint-09659] ";
          pcVar2 = "";
          goto LAB_001b05c2;
        }
      }
      goto switchD_001aec2a_caseD_103d;
    }
    if ((int)id < 0x1b0d) {
      if (id == 0x1a97) {
        pcVar3 = "[VUID-StandaloneSpirv-Uniform-06807] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x1a98) {
        pcVar3 = "[VUID-StandaloneSpirv-PushConstant-06808] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x1b0c) {
        pcVar3 = "[VUID-StandaloneSpirv-OpTypeImage-06924] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      goto switchD_001aec2a_caseD_103d;
    }
    switch(id) {
    case 0x1b81:
      pcVar3 = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041] ";
      pcVar2 = "";
      break;
    case 0x1b83:
      pcVar3 = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043] ";
      pcVar2 = "";
      break;
    case 0x1b84:
      pcVar3 = "[VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044] ";
      pcVar2 = "";
      break;
    case 0x1b87:
      pcVar3 = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047] ";
      pcVar2 = "";
      break;
    case 0x1b89:
      pcVar3 = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049] ";
      pcVar2 = "";
      break;
    case 0x1b8a:
      pcVar3 = "[VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050] ";
      pcVar2 = "";
      break;
    case 0x1b8d:
      pcVar3 = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053] ";
      pcVar2 = "";
      break;
    case 0x1b8f:
      pcVar3 = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055] ";
      pcVar2 = "";
      break;
    case 0x1b90:
      pcVar3 = "[VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056] ";
      pcVar2 = "";
      break;
    default:
      if (id == 0x1b0d) {
        pcVar3 = "[VUID-StandaloneSpirv-Uniform-06925] ";
        pcVar2 = "";
        break;
      }
      if (id == 0x1bbe) {
        pcVar3 = "[VUID-StandaloneSpirv-MeshEXT-07102] ";
        pcVar2 = "";
        break;
      }
    case 0x1b82:
    case 0x1b85:
    case 0x1b86:
    case 0x1b88:
    case 0x1b8b:
    case 0x1b8c:
    case 0x1b8e:
switchD_001aec2a_caseD_103d:
      pcVar2 = "";
      pcVar3 = "";
    }
LAB_001b05c2:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
    return __return_storage_ptr__;
  }
  if ((int)id < 0x195b) {
    if ((int)id < 0x1839) {
      switch(id) {
      case 0x1333:
        pcVar3 = "[VUID-StandaloneSpirv-Location-04915] ";
        pcVar2 = "";
        break;
      case 0x1334:
        pcVar3 = "[VUID-StandaloneSpirv-Location-04916] ";
        pcVar2 = "";
        break;
      case 0x1335:
        pcVar3 = "[VUID-StandaloneSpirv-Location-04917] ";
        pcVar2 = "";
        break;
      case 0x1336:
        pcVar3 = "[VUID-StandaloneSpirv-Location-04918] ";
        pcVar2 = "";
        break;
      case 0x1337:
        pcVar3 = "[VUID-StandaloneSpirv-Location-04919] ";
        pcVar2 = "";
        break;
      case 0x1338:
        pcVar3 = "[VUID-StandaloneSpirv-Component-04920] ";
        pcVar2 = "";
        break;
      case 0x1339:
        pcVar3 = "[VUID-StandaloneSpirv-Component-04921] ";
        pcVar2 = "";
        break;
      case 0x133a:
        pcVar3 = "[VUID-StandaloneSpirv-Component-04922] ";
        pcVar2 = "";
        break;
      case 0x133b:
        pcVar3 = "[VUID-StandaloneSpirv-Component-04923] ";
        pcVar2 = "";
        break;
      case 0x133c:
        pcVar3 = "[VUID-StandaloneSpirv-Component-04924] ";
        pcVar2 = "";
        break;
      default:
        goto switchD_001aec2a_caseD_103d;
      }
      goto LAB_001b05c2;
    }
    if ((int)id < 0x1846) {
      if (id == 0x1839) {
        pcVar3 = "[VUID-StandaloneSpirv-Flat-06201] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x183a) {
        pcVar3 = "[VUID-StandaloneSpirv-Flat-06202] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
    }
    else {
      if (id == 0x1846) {
        pcVar3 = "[VUID-StandaloneSpirv-OpTypeImage-06214] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x191a) {
        pcVar3 = "[VUID-StandaloneSpirv-LocalSize-06426] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
    }
  }
  else {
    if ((int)id < 0x1a4f) {
      switch(id) {
      case 0x1a0f:
        pcVar3 = "[VUID-StandaloneSpirv-OpTypeSampledImage-06671] ";
        pcVar2 = "";
        break;
      case 0x1a10:
        pcVar3 = "[VUID-StandaloneSpirv-Location-06672] ";
        pcVar2 = "";
        break;
      case 0x1a11:
        pcVar3 = "[VUID-StandaloneSpirv-OpVariable-06673] ";
        pcVar2 = "";
        break;
      case 0x1a12:
        pcVar3 = "[VUID-StandaloneSpirv-OpEntryPoint-06674] ";
        pcVar2 = "";
        break;
      case 0x1a13:
        pcVar3 = "[VUID-StandaloneSpirv-PushConstant-06675] ";
        pcVar2 = "";
        break;
      case 0x1a14:
        pcVar3 = "[VUID-StandaloneSpirv-Uniform-06676] ";
        pcVar2 = "";
        break;
      case 0x1a15:
        pcVar3 = "[VUID-StandaloneSpirv-UniformConstant-06677] ";
        pcVar2 = "";
        break;
      case 0x1a16:
        pcVar3 = "[VUID-StandaloneSpirv-InputAttachmentIndex-06678] ";
        pcVar2 = "";
        break;
      default:
        if (id == 0x195b) {
          pcVar3 = "[VUID-StandaloneSpirv-DescriptorSet-06491] ";
          pcVar2 = "";
          break;
        }
        goto switchD_001aec2a_caseD_103d;
      }
      goto LAB_001b05c2;
    }
    if ((int)id < 0x1a51) {
      if (id == 0x1a4f) {
        pcVar3 = "[VUID-CullMaskKHR-CullMaskKHR-06735] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x1a50) {
        pcVar3 = "[VUID-CullMaskKHR-CullMaskKHR-06736] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
    }
    else {
      if (id == 0x1a51) {
        pcVar3 = "[VUID-CullMaskKHR-CullMaskKHR-06737] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x1a79) {
        pcVar3 = "[VUID-StandaloneSpirv-PerVertexKHR-06777] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
      if (id == 0x1a7a) {
        pcVar3 = "[VUID-StandaloneSpirv-Input-06778] ";
        pcVar2 = "";
        goto LAB_001b05c2;
      }
    }
  }
  goto switchD_001aec2a_caseD_103d;
}

Assistant:

std::string ValidationState_t::VkErrorID(uint32_t id,
                                         const char* /*reference*/) const {
  if (!spvIsVulkanEnv(context_->target_env)) {
    return "";
  }

  // This large switch case is only searched when an error has occurred.
  // If an id is changed, the old case must be modified or removed. Each string
  // here is interpreted as being "implemented"

  // Clang format adds spaces between hyphens
  // clang-format off
  switch (id) {
    case 4154:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04154);
    case 4155:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04155);
    case 4156:
      return VUID_WRAP(VUID-BaryCoordKHR-BaryCoordKHR-04156);
    case 4160:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04160);
    case 4161:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04161);
    case 4162:
      return VUID_WRAP(VUID-BaryCoordNoPerspKHR-BaryCoordNoPerspKHR-04162);
    case 4181:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04181);
    case 4182:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04182);
    case 4183:
      return VUID_WRAP(VUID-BaseInstance-BaseInstance-04183);
    case 4184:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04184);
    case 4185:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04185);
    case 4186:
      return VUID_WRAP(VUID-BaseVertex-BaseVertex-04186);
    case 4187:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04187);
    case 4188:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04188);
    case 4189:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04189);
    case 4190:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04190);
    case 4191:
      return VUID_WRAP(VUID-ClipDistance-ClipDistance-04191);
    case 4196:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04196);
    case 4197:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04197);
    case 4198:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04198);
    case 4199:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04199);
    case 4200:
      return VUID_WRAP(VUID-CullDistance-CullDistance-04200);
    case 6735:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06735); // Execution Model
    case 6736:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06736); // input storage
    case 6737:
      return VUID_WRAP(VUID-CullMaskKHR-CullMaskKHR-06737); // 32 int scalar
    case 4205:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04205);
    case 4206:
      return VUID_WRAP(VUID-DeviceIndex-DeviceIndex-04206);
    case 4207:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04207);
    case 4208:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04208);
    case 4209:
      return VUID_WRAP(VUID-DrawIndex-DrawIndex-04209);
    case 4210:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04210);
    case 4211:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04211);
    case 4212:
      return VUID_WRAP(VUID-FragCoord-FragCoord-04212);
    case 4213:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04213);
    case 4214:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04214);
    case 4215:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04215);
    case 4216:
      return VUID_WRAP(VUID-FragDepth-FragDepth-04216);
    case 4217:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04217);
    case 4218:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04218);
    case 4219:
      return VUID_WRAP(VUID-FragInvocationCountEXT-FragInvocationCountEXT-04219);
    case 4220:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04220);
    case 4221:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04221);
    case 4222:
      return VUID_WRAP(VUID-FragSizeEXT-FragSizeEXT-04222);
    case 4223:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04223);
    case 4224:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04224);
    case 4225:
      return VUID_WRAP(VUID-FragStencilRefEXT-FragStencilRefEXT-04225);
    case 4229:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04229);
    case 4230:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04230);
    case 4231:
      return VUID_WRAP(VUID-FrontFacing-FrontFacing-04231);
    case 4232:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04232);
    case 4233:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04233);
    case 4234:
      return VUID_WRAP(VUID-FullyCoveredEXT-FullyCoveredEXT-04234);
    case 4236:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04236);
    case 4237:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04237);
    case 4238:
      return VUID_WRAP(VUID-GlobalInvocationId-GlobalInvocationId-04238);
    case 4239:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04239);
    case 4240:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04240);
    case 4241:
      return VUID_WRAP(VUID-HelperInvocation-HelperInvocation-04241);
    case 4242:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04242);
    case 4243:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04243);
    case 4244:
      return VUID_WRAP(VUID-HitKindKHR-HitKindKHR-04244);
    case 4245:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04245);
    case 4246:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04246);
    case 4247:
      return VUID_WRAP(VUID-HitTNV-HitTNV-04247);
    case 4248:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04248);
    case 4249:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04249);
    case 4250:
      return VUID_WRAP(VUID-IncomingRayFlagsKHR-IncomingRayFlagsKHR-04250);
    case 4251:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04251);
    case 4252:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04252);
    case 4253:
      return VUID_WRAP(VUID-InstanceCustomIndexKHR-InstanceCustomIndexKHR-04253);
    case 4254:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04254);
    case 4255:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04255);
    case 4256:
      return VUID_WRAP(VUID-InstanceId-InstanceId-04256);
    case 4257:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04257);
    case 4258:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04258);
    case 4259:
      return VUID_WRAP(VUID-InvocationId-InvocationId-04259);
    case 4263:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04263);
    case 4264:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04264);
    case 4265:
      return VUID_WRAP(VUID-InstanceIndex-InstanceIndex-04265);
    case 4266:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04266);
    case 4267:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04267);
    case 4268:
      return VUID_WRAP(VUID-LaunchIdKHR-LaunchIdKHR-04268);
    case 4269:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04269);
    case 4270:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04270);
    case 4271:
      return VUID_WRAP(VUID-LaunchSizeKHR-LaunchSizeKHR-04271);
    case 4272:
      return VUID_WRAP(VUID-Layer-Layer-04272);
    case 4273:
      return VUID_WRAP(VUID-Layer-Layer-04273);
    case 4274:
      return VUID_WRAP(VUID-Layer-Layer-04274);
    case 4275:
      return VUID_WRAP(VUID-Layer-Layer-04275);
    case 4276:
      return VUID_WRAP(VUID-Layer-Layer-04276);
    case 4281:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04281);
    case 4282:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04282);
    case 4283:
      return VUID_WRAP(VUID-LocalInvocationId-LocalInvocationId-04283);
    case 4293:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04293);
    case 4294:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04294);
    case 4295:
      return VUID_WRAP(VUID-NumSubgroups-NumSubgroups-04295);
    case 4296:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04296);
    case 4297:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04297);
    case 4298:
      return VUID_WRAP(VUID-NumWorkgroups-NumWorkgroups-04298);
    case 4299:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04299);
    case 4300:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04300);
    case 4301:
      return VUID_WRAP(VUID-ObjectRayDirectionKHR-ObjectRayDirectionKHR-04301);
    case 4302:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04302);
    case 4303:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04303);
    case 4304:
      return VUID_WRAP(VUID-ObjectRayOriginKHR-ObjectRayOriginKHR-04304);
    case 4305:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04305);
    case 4306:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04306);
    case 4307:
      return VUID_WRAP(VUID-ObjectToWorldKHR-ObjectToWorldKHR-04307);
    case 4308:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04308);
    case 4309:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04309);
    case 4310:
      return VUID_WRAP(VUID-PatchVertices-PatchVertices-04310);
    case 4311:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04311);
    case 4312:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04312);
    case 4313:
      return VUID_WRAP(VUID-PointCoord-PointCoord-04313);
    case 4314:
      return VUID_WRAP(VUID-PointSize-PointSize-04314);
    case 4315:
      return VUID_WRAP(VUID-PointSize-PointSize-04315);
    case 4316:
      return VUID_WRAP(VUID-PointSize-PointSize-04316);
    case 4317:
      return VUID_WRAP(VUID-PointSize-PointSize-04317);
    case 4318:
      return VUID_WRAP(VUID-Position-Position-04318);
    case 4319:
      return VUID_WRAP(VUID-Position-Position-04319);
    case 4320:
      return VUID_WRAP(VUID-Position-Position-04320);
    case 4321:
      return VUID_WRAP(VUID-Position-Position-04321);
    case 4330:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04330);
    case 4334:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04334);
    case 4337:
      return VUID_WRAP(VUID-PrimitiveId-PrimitiveId-04337);
    case 4345:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04345);
    case 4346:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04346);
    case 4347:
      return VUID_WRAP(VUID-RayGeometryIndexKHR-RayGeometryIndexKHR-04347);
    case 4348:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04348);
    case 4349:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04349);
    case 4350:
      return VUID_WRAP(VUID-RayTmaxKHR-RayTmaxKHR-04350);
    case 4351:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04351);
    case 4352:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04352);
    case 4353:
      return VUID_WRAP(VUID-RayTminKHR-RayTminKHR-04353);
    case 4354:
      return VUID_WRAP(VUID-SampleId-SampleId-04354);
    case 4355:
      return VUID_WRAP(VUID-SampleId-SampleId-04355);
    case 4356:
      return VUID_WRAP(VUID-SampleId-SampleId-04356);
    case 4357:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04357);
    case 4358:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04358);
    case 4359:
      return VUID_WRAP(VUID-SampleMask-SampleMask-04359);
    case 4360:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04360);
    case 4361:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04361);
    case 4362:
      return VUID_WRAP(VUID-SamplePosition-SamplePosition-04362);
    case 4367:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04367);
    case 4368:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04368);
    case 4369:
      return VUID_WRAP(VUID-SubgroupId-SubgroupId-04369);
    case 4370:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04370);
    case 4371:
      return VUID_WRAP(VUID-SubgroupEqMask-SubgroupEqMask-04371);
    case 4372:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04372);
    case 4373:
      return VUID_WRAP(VUID-SubgroupGeMask-SubgroupGeMask-04373);
    case 4374:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04374);
    case 4375:
      return VUID_WRAP(VUID-SubgroupGtMask-SubgroupGtMask-04375);
    case 4376:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04376);
    case 4377:
      return VUID_WRAP(VUID-SubgroupLeMask-SubgroupLeMask-04377);
    case 4378:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04378);
    case 4379:
      return VUID_WRAP(VUID-SubgroupLtMask-SubgroupLtMask-04379);
    case 4380:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04380);
    case 4381:
      return VUID_WRAP(VUID-SubgroupLocalInvocationId-SubgroupLocalInvocationId-04381);
    case 4382:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04382);
    case 4383:
      return VUID_WRAP(VUID-SubgroupSize-SubgroupSize-04383);
    case 4387:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04387);
    case 4388:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04388);
    case 4389:
      return VUID_WRAP(VUID-TessCoord-TessCoord-04389);
    case 4390:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04390);
    case 4391:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04391);
    case 4392:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04392);
    case 4393:
      return VUID_WRAP(VUID-TessLevelOuter-TessLevelOuter-04393);
    case 4394:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04394);
    case 4395:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04395);
    case 4396:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04396);
    case 4397:
      return VUID_WRAP(VUID-TessLevelInner-TessLevelInner-04397);
    case 4398:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04398);
    case 4399:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04399);
    case 4400:
      return VUID_WRAP(VUID-VertexIndex-VertexIndex-04400);
    case 4401:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04401);
    case 4402:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04402);
    case 4403:
      return VUID_WRAP(VUID-ViewIndex-ViewIndex-04403);
    case 4404:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04404);
    case 4405:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04405);
    case 4406:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04406);
    case 4407:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04407);
    case 4408:
      return VUID_WRAP(VUID-ViewportIndex-ViewportIndex-04408);
    case 4422:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04422);
    case 4423:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04423);
    case 4424:
      return VUID_WRAP(VUID-WorkgroupId-WorkgroupId-04424);
    case 4425:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04425);
    case 4426:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04426);
    case 4427:
      return VUID_WRAP(VUID-WorkgroupSize-WorkgroupSize-04427);
    case 4428:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04428);
    case 4429:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04429);
    case 4430:
      return VUID_WRAP(VUID-WorldRayDirectionKHR-WorldRayDirectionKHR-04430);
    case 4431:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04431);
    case 4432:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04432);
    case 4433:
      return VUID_WRAP(VUID-WorldRayOriginKHR-WorldRayOriginKHR-04433);
    case 4434:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04434);
    case 4435:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04435);
    case 4436:
      return VUID_WRAP(VUID-WorldToObjectKHR-WorldToObjectKHR-04436);
    case 4484:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04484);
    case 4485:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04485);
    case 4486:
      return VUID_WRAP(VUID-PrimitiveShadingRateKHR-PrimitiveShadingRateKHR-04486);
    case 4490:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04490);
    case 4491:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04491);
    case 4492:
      return VUID_WRAP(VUID-ShadingRateKHR-ShadingRateKHR-04492);
    case 4633:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04633);
    case 4634:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04634);
    case 4635:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04635);
    case 4636:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04636);
    case 4637:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04637);
    case 4638:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04638);
    case 7321:
      return VUID_WRAP(VUID-StandaloneSpirv-None-07321);
    case 4640:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04640);
    case 4641:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04641);
    case 4642:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04642);
    case 4643:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04643);
    case 4644:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04644);
    case 4645:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04645);
    case 4650:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04650);
    case 4651:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04651);
    case 4652:
      return VUID_WRAP(VUID-StandaloneSpirv-OpReadClockKHR-04652);
    case 4653:
      return VUID_WRAP(VUID-StandaloneSpirv-OriginLowerLeft-04653);
    case 4654:
      return VUID_WRAP(VUID-StandaloneSpirv-PixelCenterInteger-04654);
    case 4655:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-04655);
    case 4656:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04656);
    case 4657:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-04657);
    case 4658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageTexelPointer-04658);
    case 4659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageQuerySizeLod-04659);
    case 4663:
      return VUID_WRAP(VUID-StandaloneSpirv-Offset-04663);
    case 4664:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImageGather-04664);
    case 4667:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04667);
    case 4669:
      return VUID_WRAP(VUID-StandaloneSpirv-GLSLShared-04669);
    case 4670:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04670);
    case 4675:
      return VUID_WRAP(VUID-StandaloneSpirv-FPRoundingMode-04675);
    case 4677:
      return VUID_WRAP(VUID-StandaloneSpirv-Invariant-04677);
    case 4680:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeRuntimeArray-04680);
    case 4682:
      return VUID_WRAP(VUID-StandaloneSpirv-OpControlBarrier-04682);
    case 6426:
      return VUID_WRAP(VUID-StandaloneSpirv-LocalSize-06426); // formally 04683
    case 4685:
      return VUID_WRAP(VUID-StandaloneSpirv-OpGroupNonUniformBallotBitCount-04685);
    case 4686:
      return VUID_WRAP(VUID-StandaloneSpirv-None-04686);
    case 4698:
      return VUID_WRAP(VUID-StandaloneSpirv-RayPayloadKHR-04698);
    case 4699:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04699);
    case 4700:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingRayPayloadKHR-04700);
    case 4701:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04701);
    case 4702:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04702);
    case 4703:
      return VUID_WRAP(VUID-StandaloneSpirv-HitAttributeKHR-04703);
    case 4704:
      return VUID_WRAP(VUID-StandaloneSpirv-CallableDataKHR-04704);
    case 4705:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04705);
    case 4706:
      return VUID_WRAP(VUID-StandaloneSpirv-IncomingCallableDataKHR-04706);
    case 7119:
      return VUID_WRAP(VUID-StandaloneSpirv-ShaderRecordBufferKHR-07119);
    case 4708:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04708);
    case 4710:
      return VUID_WRAP(VUID-StandaloneSpirv-PhysicalStorageBuffer64-04710);
    case 4711:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeForwardPointer-04711);
    case 4730:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicStore-04730);
    case 4731:
      return VUID_WRAP(VUID-StandaloneSpirv-OpAtomicLoad-04731);
    case 4732:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04732);
    case 4733:
      return VUID_WRAP(VUID-StandaloneSpirv-OpMemoryBarrier-04733);
    case 4734:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-04734);
    case 4744:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-04744);
    case 4777:
      return VUID_WRAP(VUID-StandaloneSpirv-OpImage-04777);
    case 4780:
      return VUID_WRAP(VUID-StandaloneSpirv-Result-04780);
    case 4781:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-04781);
    case 4915:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04915);
    case 4916:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04916);
    case 4917:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04917);
    case 4918:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04918);
    case 4919:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-04919);
    case 4920:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04920);
    case 4921:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04921);
    case 4922:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04922);
    case 4923:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04923);
    case 4924:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-04924);
    case 6201:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06201);
    case 6202:
      return VUID_WRAP(VUID-StandaloneSpirv-Flat-06202);
    case 6214:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06214);
    case 6491:
      return VUID_WRAP(VUID-StandaloneSpirv-DescriptorSet-06491);
    case 6671:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeSampledImage-06671);
    case 6672:
      return VUID_WRAP(VUID-StandaloneSpirv-Location-06672);
    case 6673:
      return VUID_WRAP(VUID-StandaloneSpirv-OpVariable-06673);
    case 6674:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-06674);
    case 6675:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06675);
    case 6676:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06676);
    case 6677:
      return VUID_WRAP(VUID-StandaloneSpirv-UniformConstant-06677);
    case 6678:
      return VUID_WRAP(VUID-StandaloneSpirv-InputAttachmentIndex-06678);
    case 6777:
      return VUID_WRAP(VUID-StandaloneSpirv-PerVertexKHR-06777);
    case 6778:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-06778);
    case 6807:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06807);
    case 6808:
      return VUID_WRAP(VUID-StandaloneSpirv-PushConstant-06808);
    case 6924:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-06924);
    case 6925:
      return VUID_WRAP(VUID-StandaloneSpirv-Uniform-06925);
    case 7041:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07041);
    case 7043:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07043);
    case 7044:
      return VUID_WRAP(VUID-PrimitivePointIndicesEXT-PrimitivePointIndicesEXT-07044);
    case 7047:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07047);
    case 7049:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07049);
    case 7050:
      return VUID_WRAP(VUID-PrimitiveLineIndicesEXT-PrimitiveLineIndicesEXT-07050);
    case 7053:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07053);
    case 7055:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07055);
    case 7056:
      return VUID_WRAP(VUID-PrimitiveTriangleIndicesEXT-PrimitiveTriangleIndicesEXT-07056);
    case 7102:
      return VUID_WRAP(VUID-StandaloneSpirv-MeshEXT-07102);
    case 7320:
      return VUID_WRAP(VUID-StandaloneSpirv-ExecutionModel-07320);
    case 7290:
      return VUID_WRAP(VUID-StandaloneSpirv-Input-07290);
    case 7650:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07650);
    case 7651:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07651);
    case 7652:
      return VUID_WRAP(VUID-StandaloneSpirv-Base-07652);
    case 7703:
      return VUID_WRAP(VUID-StandaloneSpirv-Component-07703);
    case 7951:
      return VUID_WRAP(VUID-StandaloneSpirv-SubgroupVoteKHR-07951);
    case 8721:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08721);
    case 8722:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-08722);
    case 8973:
      return VUID_WRAP(VUID-StandaloneSpirv-Pointer-08973);
    case 9638:
      return VUID_WRAP(VUID-StandaloneSpirv-OpTypeImage-09638);
    case 9658:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09658);
    case 9659:
      return VUID_WRAP(VUID-StandaloneSpirv-OpEntryPoint-09659);
    default:
      return "";  // unknown id
  }
  // clang-format on
}